

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::SingularVarBigint<long,unsigned_char,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong *puVar4;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar6;
  ushort *ptr_00;
  uint *puVar7;
  Spill spill;
  
  if (-1 < (long)*ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x31c);
  }
  aVar6.data = (long)ptr[1] << 7 | 0x7f;
  if ((long)aVar6 < 0) {
    uVar3 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar3 < 0) {
      aVar6.data = aVar6.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)aVar6 < 0) {
        uVar3 = uVar3 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar3 < 0) {
          aVar6.data = aVar6.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)aVar6 < 0) {
            uVar3 = uVar3 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar3 < 0) {
              aVar6.data = aVar6.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)aVar6 < 0) {
                uVar3 = uVar3 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar3 < 0) {
                  bVar1 = ptr[9];
                  ptr_00 = (ushort *)(ptr + 10);
                  if (bVar1 != 1) {
                    if ((char)bVar1 < '\0') {
                      pcVar5 = Error(msg,(char *)ptr_00,ctx,(TcFieldData)aVar6,table,hasbits);
                      return pcVar5;
                    }
                    if ((bVar1 & 1) == 0) {
                      uVar3 = uVar3 ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  ptr_00 = (ushort *)(ptr + 9);
                }
              }
              else {
                ptr_00 = (ushort *)(ptr + 8);
              }
            }
            else {
              ptr_00 = (ushort *)(ptr + 7);
            }
          }
          else {
            ptr_00 = (ushort *)(ptr + 6);
          }
        }
        else {
          ptr_00 = (ushort *)(ptr + 5);
        }
      }
      else {
        ptr_00 = (ushort *)(ptr + 4);
      }
    }
    else {
      ptr_00 = (ushort *)(ptr + 3);
    }
    aVar6.data = aVar6.data & uVar3;
  }
  else {
    ptr_00 = (ushort *)(ptr + 2);
  }
  puVar4 = (ulong *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 7) != 0) {
    AlignFail(puVar4);
  }
  uVar3 = aVar6.data & (long)*ptr;
  *puVar4 = -(ulong)((uint)uVar3 & 1) ^ uVar3 >> 1;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr_00) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar7 & 3) != 0) {
        AlignFail();
      }
      *puVar7 = *puVar7 | (uint)hasbits;
    }
    return (char *)ptr_00;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*ptr_00;
  if ((uVar2 & 7) == 0) {
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar2 & 0xfffffff8)))();
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  // For some reason clang wants to save 5 registers to the stack here,
  // but we only need four for this code, so save the data we don't need
  // to the stack.  Happily, saving them this way uses regular store
  // instructions rather than PUSH/POP, which saves time at the cost of greater
  // code size, but for this heavily-used piece of code, that's fine.
  struct Spill {
    uint64_t field_data;
    ::google::protobuf::MessageLite* msg;
    const ::google::protobuf::internal::TcParseTableBase* table;
    uint64_t hasbits;
  };
  Spill spill = {data.data, msg, table, hasbits};
#if defined(__GNUC__)
  // This empty asm block convinces the compiler that the contents of spill may
  // have changed, and thus can't be cached in registers.  It's similar to, but
  // more optimal than, the effect of declaring it "volatile".
  asm("" : "+m"(spill));
#endif

  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  data.data = spill.field_data;
  msg = spill.msg;
  table = spill.table;
  hasbits = spill.hasbits;

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}